

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O1

void __thiscall HeavyLight_Chains_Test::TestBody(HeavyLight_Chains_Test *this)

{
  long lVar1;
  pointer piVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  char *message;
  pointer pvVar7;
  AssertHelper local_60;
  pointer local_58;
  ulong local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  srand(1);
  local_50 = 0;
  do {
    lVar4 = 8;
    do {
      lVar1 = *(long *)((long)pred[0x30d49] + lVar4 + 0x48);
      if (*(long *)((long)&g[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4) != lVar1) {
        *(long *)((long)&g[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4) = lVar1;
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x4b8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&chains);
    generateTree(0x32);
    initHLD(0,0x32);
    local_58 = chains.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pvVar7 = chains.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (chains.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        chains.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        uVar5 = (ulong)((long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        uVar6 = (int)uVar5 - 1;
        if (0 < (int)uVar6) {
          uVar5 = (uVar5 & 0xffffffff) + 0xfffffffe;
          lVar4 = (ulong)uVar6 + 1;
          do {
            piVar2 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            testing::internal::CmpHelperEQ<int,int>
                      (local_48,"c[i - 1]","pred[c[i]][0]",piVar2 + (uVar5 & 0xffffffff),
                       pred[piVar2[lVar4 + -1]]);
            if (local_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&gtest_ar.message_);
              message = "";
              if (gtest_ar._0_8_ != 0) {
                message = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/heavylight_test.cpp"
                         ,0x1a,message);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar.message_);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                  (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
                }
                gtest_ar.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar5 = uVar5 - 1;
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        pvVar7 = pvVar7 + 1;
      } while (pvVar7 != local_58);
    }
    uVar6 = (int)local_50 + 1;
    local_50 = (ulong)uVar6;
  } while (uVar6 != 10);
  return;
}

Assistant:

TEST(HeavyLight, Chains) {
    srand(1);
    int n = 50;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        for (auto &c : chains) {
            per(i, 1, c.size()) {
                EXPECT_EQ(c[i - 1], pred[c[i]][0]);
            }
        }
    }
}